

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O0

void anon_unknown.dwarf_228b70::writeCopyRead(string *tempDir,int w,int h,int xs,int ys)

{
  int ts;
  int tb;
  int rmode;
  int lorder;
  int comp;
  string filename;
  undefined1 in_stack_0000046a;
  undefined1 in_stack_0000046b;
  int in_stack_0000046c;
  LevelRoundingMode in_stack_00000470;
  LineOrder in_stack_00000474;
  int in_stack_00000478;
  int in_stack_0000047c;
  char *in_stack_00000480;
  int in_stack_00000490;
  Compression in_stack_00000498;
  undefined1 in_stack_0000050a;
  undefined1 in_stack_0000050b;
  int in_stack_0000050c;
  LevelRoundingMode in_stack_00000510;
  LineOrder in_stack_00000514;
  int in_stack_00000518;
  int in_stack_0000051c;
  char *in_stack_00000520;
  int in_stack_00000530;
  Compression in_stack_00000538;
  undefined1 in_stack_000005da;
  undefined1 in_stack_000005db;
  int in_stack_000005dc;
  LevelRoundingMode in_stack_000005e0;
  LineOrder in_stack_000005e4;
  int in_stack_000005e8;
  int in_stack_000005ec;
  char *in_stack_000005f0;
  int in_stack_00000600;
  Compression in_stack_00000608;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  string local_48 [56];
  
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  for (local_4c = 0; local_4c < 10; local_4c = local_4c + 1) {
    if ((local_4c != 6) && (local_4c != 7)) {
      for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
        for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
          for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
            for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
              std::__cxx11::string::c_str();
              writeCopyReadONE(in_stack_00000480,in_stack_0000047c,in_stack_00000478,
                               in_stack_00000474,in_stack_00000470,in_stack_0000046c,
                               in_stack_00000490,in_stack_00000498,(bool)in_stack_0000046b,
                               (bool)in_stack_0000046a);
              std::__cxx11::string::c_str();
              writeCopyReadMIP(in_stack_00000520,in_stack_0000051c,in_stack_00000518,
                               in_stack_00000514,in_stack_00000510,in_stack_0000050c,
                               in_stack_00000530,in_stack_00000538,(bool)in_stack_0000050b,
                               (bool)in_stack_0000050a);
              std::__cxx11::string::c_str();
              writeCopyReadRIP(in_stack_000005f0,in_stack_000005ec,in_stack_000005e8,
                               in_stack_000005e4,in_stack_000005e0,in_stack_000005dc,
                               in_stack_00000600,in_stack_00000608,(bool)in_stack_000005db,
                               (bool)in_stack_000005da);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
writeCopyRead (const std::string& tempDir, int w, int h, int xs, int ys)
{
    std::string filename = tempDir + "imf_test_copy.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION) { continue; }

        for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
        {
            for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
            {
                for (int tb = 0; tb <= 1; ++tb)
                {
                    for (int ts = 0; ts <= 1; ++ts)
                    {
                        writeCopyReadONE (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadMIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadRIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);
                    }
                }
            }
        }
    }
}